

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint16 crnd::crc16(void *pBuf,uint32 len,uint16 crc)

{
  ushort uVar1;
  uint16 r;
  byte *pbStack_20;
  uint16 q;
  uint8 *p;
  uint16 crc_local;
  uint32 len_local;
  void *pBuf_local;
  
  p._2_2_ = crc ^ 0xffff;
  pbStack_20 = (byte *)pBuf;
  for (p._4_4_ = len; p._4_4_ != 0; p._4_4_ = p._4_4_ - 1) {
    uVar1 = (ushort)*pbStack_20 ^ p._2_2_ >> 8;
    uVar1 = (ushort)((int)(uint)uVar1 >> 4) ^ uVar1;
    p._2_2_ = p._2_2_ << 8 ^ uVar1 ^ uVar1 << 5 ^ uVar1 << 0xc;
    pbStack_20 = pbStack_20 + 1;
  }
  return p._2_2_ ^ 0xffff;
}

Assistant:

uint16 crc16(const void* pBuf, uint32 len, uint16 crc) {
  crc = ~crc;

  const uint8* p = reinterpret_cast<const uint8*>(pBuf);
  while (len) {
    const uint16 q = *p++ ^ (crc >> 8U);
    crc <<= 8U;

    uint16 r = (q >> 4U) ^ q;
    crc ^= r;
    r <<= 5U;
    crc ^= r;
    r <<= 7U;
    crc ^= r;

    len--;
  }

  return static_cast<uint16>(~crc);
}